

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::HashMap<kj::String,_int>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<kj::String,_int>::Entry> *this,char *__file,__off_t __length)

{
  long lVar1;
  int in_EAX;
  int extraout_EAX;
  Array<char> *this_00;
  
  lVar1 = *(long *)this;
  while ((ulong)((long)__file * 0x20 + lVar1) < *(ulong *)(this + 8)) {
    this_00 = (Array<char> *)(*(ulong *)(this + 8) - 0x20);
    *(Array<char> **)(this + 8) = this_00;
    Array<char>::~Array(this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }